

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall AggressiveBotStrategy::attackToCountryIndex(AggressiveBotStrategy *this)

{
  Country *pCVar1;
  pointer ppCVar2;
  Country *pCVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Country *pCVar8;
  
  pCVar1 = (this->super_PlayerStrategy).from;
  ppCVar2 = (pCVar1->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(pCVar1->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppCVar2;
  if (lVar6 == 0) {
    pCVar8 = (Country *)0x0;
    iVar4 = 0;
  }
  else {
    lVar6 = lVar6 >> 3;
    uVar7 = 0;
    uVar5 = 0;
    pCVar8 = (Country *)0x0;
    do {
      if (pCVar8 == (Country *)0x0) {
        pCVar8 = (Country *)0x0;
        if (*ppCVar2[uVar7]->pPlayerOwnerId != *pCVar1->pPlayerOwnerId) {
          uVar5 = uVar7 & 0xffffffff;
          pCVar8 = ppCVar2[uVar7];
        }
      }
      if (pCVar8 == (Country *)0x0) {
        pCVar8 = (Country *)0x0;
      }
      else {
        pCVar3 = ppCVar2[uVar7];
        if ((*pCVar3->pNumberOfTroops < *pCVar8->pNumberOfTroops) &&
           (*pCVar3->pPlayerOwnerId != *pCVar1->pPlayerOwnerId)) {
          uVar5 = uVar7 & 0xffffffff;
          pCVar8 = pCVar3;
        }
      }
      iVar4 = (int)uVar5;
      uVar7 = uVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != uVar7);
  }
  (this->super_PlayerStrategy).to = pCVar8;
  return iVar4;
}

Assistant:

int AggressiveBotStrategy::attackToCountryIndex() {
    Map::Country* smallestNeighbour = nullptr;
    unsigned int index = 0;
    for (unsigned long i = 0; i < from->getAdjCountries()->size(); i++) {
        if (smallestNeighbour == nullptr && from->getAdjCountries()->at(i)->getPlayerOwnerID() != from->getPlayerOwnerID()) {
            smallestNeighbour = from->getAdjCountries()->at(i);
            index = i;
        }
        if (smallestNeighbour != nullptr && smallestNeighbour->getNumberOfTroops() > from->getAdjCountries()->at(i)->getNumberOfTroops() && from->getAdjCountries()->at(i)->getPlayerOwnerID()!= from->getPlayerOwnerID()) {
            smallestNeighbour = from->getAdjCountries()->at(i);
            index = i;
        }
    }

    to = smallestNeighbour;
    return (int) index;
}